

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

int __thiscall spdlog::details::registry::shutdown(registry *this,int __fd,int __how)

{
  int extraout_EAX;
  lock_guard<std::recursive_mutex> lock_1;
  lock_guard<std::mutex> lock;
  pointer in_stack_ffffffffffffffd8;
  __shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)this,(mutex_type *)in_stack_ffffffffffffffd8);
  std::
  unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
  ::reset((unique_ptr<spdlog::details::periodic_worker,_std::default_delete<spdlog::details::periodic_worker>_>
           *)this,in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5f8200);
  drop_all(this);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)this,(mutex_type *)in_stack_ffffffffffffffd8);
  std::__shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>::reset
            (in_stack_fffffffffffffff0);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x5f8238);
  return extraout_EAX;
}

Assistant:

SPDLOG_INLINE void registry::shutdown() {
    {
        std::lock_guard<std::mutex> lock(flusher_mutex_);
        periodic_flusher_.reset();
    }

    drop_all();

    {
        std::lock_guard<std::recursive_mutex> lock(tp_mutex_);
        tp_.reset();
    }
}